

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<64u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<64u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  uint *puVar2;
  int *piVar3;
  undefined8 uVar4;
  unsigned_fast_type i;
  byte bVar5;
  sbyte sVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  result_type range;
  result_type result;
  value_type_conflict local_40 [2];
  undefined8 local_38;
  array<unsigned_int,_2UL> local_30;
  undefined8 local_28;
  uint local_20 [2];
  
  local_30.elems[0] = 0;
  local_30.elems[1] = 0;
  uVar9 = input_generator->_M_x;
  uVar11 = 0;
  bVar10 = 1;
  lVar7 = 0;
  do {
    bVar5 = bVar10 - 1 & 3;
    if (bVar5 == 0) {
      uVar12 = (uVar9 % 0xadc8) * 0xbc8f;
      uVar11 = (uVar9 / 0xadc8) * 0xd47;
      uVar9 = (uVar9 / 0xadc8) * -0xd47;
      if (uVar12 < uVar11) {
        uVar9 = uVar11 ^ 0x7fffffff;
      }
      uVar9 = uVar9 + uVar12;
      input_generator->_M_x = uVar9;
      uVar11 = uVar9;
    }
    sVar6 = bVar5 << 3;
    puVar1 = (uint *)((long)local_30.elems + lVar7);
    *puVar1 = *puVar1 | (uVar11 >> sVar6 & 0xff) << sVar6;
    lVar7 = lVar7 + (ulong)((bVar10 & 3) == 0) * 4;
    bVar10 = bVar10 + 1;
  } while (lVar7 != 8);
  uVar4 = *(undefined8 *)input_params;
  local_40[0] = (int)uVar4;
  local_40[1] = (int)((ulong)uVar4 >> 0x20);
  local_38 = 0;
  lVar7 = 4;
  do {
    bVar10 = 0;
    if (lVar7 == -4) break;
    puVar1 = (uint *)((long)local_40 + lVar7);
    puVar2 = (uint *)((long)&local_38 + lVar7);
    bVar10 = -(*puVar1 <= *puVar2) | 1;
    lVar7 = lVar7 + -4;
  } while (*puVar1 == *puVar2);
  if (bVar10 == 0) {
    local_28 = *(undefined8 *)
                (input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
    local_20[0] = 0xffffffff;
    local_20[1] = 0xffffffff;
    lVar7 = 4;
    do {
      bVar10 = 0;
      if (lVar7 == -4) break;
      puVar1 = (uint *)((long)&local_28 + lVar7);
      puVar2 = (uint *)((long)local_20 + lVar7);
      bVar10 = -(*puVar1 <= *puVar2) | 1;
      lVar7 = lVar7 + -4;
    } while (*puVar1 == *puVar2);
    if (bVar10 == 0) goto LAB_00149e29;
  }
  local_28 = uVar4;
  local_40 = (value_type_conflict  [2])
             *(undefined8 *)
              (input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  lVar7 = 0;
  bVar13 = false;
  do {
    uVar8 = ((ulong)local_40[lVar7] - (ulong)bVar13) - (ulong)*(uint *)((long)&local_28 + lVar7 * 4)
    ;
    local_40[lVar7] = (value_type_conflict)uVar8;
    bVar13 = uVar8 >> 0x20 != 0;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  local_38._0_4_ = local_40[0];
  local_38._4_4_ = local_40[1];
  lVar7 = 0;
  do {
    piVar3 = (int *)((long)&local_38 + lVar7);
    *piVar3 = *piVar3 + 1;
    if (*piVar3 != 0) break;
    bVar13 = lVar7 != 4;
    lVar7 = lVar7 + 4;
  } while (bVar13);
  local_40[0] = 0;
  local_40[1] = 0;
  uintwide_t<64U,_unsigned_int,_void,_false>::eval_divide_knuth
            ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_38,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_40);
  local_30.elems[0] = local_40[0];
  local_30.elems[1] = local_40[1];
  local_40 = *(value_type_conflict (*) [2])input_params;
  uintwide_t<64U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_30,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_40);
LAB_00149e29:
  return (result_type)local_30.elems[0]._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }